

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

QByteArray *
makeCookieHeader(QByteArray *__return_storage_ptr__,QList<QNetworkCookie> *cookies,RawForm type,
                QByteArrayView separator)

{
  QNetworkCookie *cookie;
  QNetworkCookie *this;
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this = (cookies->d).ptr;
  for (lVar1 = (cookies->d).size << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    QNetworkCookie::toRawForm((QByteArray *)&local_50,this,type);
    QByteArray::append(__return_storage_ptr__);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    QByteArray::append(__return_storage_ptr__,separator);
    this = this + 1;
  }
  if ((__return_storage_ptr__->d).size != 0) {
    QByteArray::chop((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray makeCookieHeader(const QList<QNetworkCookie> &cookies,
                                   QNetworkCookie::RawForm type,
                                   QByteArrayView separator)
{
    QByteArray result;
    for (const QNetworkCookie &cookie : cookies) {
        result += cookie.toRawForm(type);
        result += separator;
    }
    if (!result.isEmpty())
        result.chop(separator.size());
    return result;
}